

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::PReLU_x86_fma::forward_inplace(PReLU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  void *pvVar5;
  float *pfVar6;
  size_t sVar7;
  size_t sVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  undefined1 (*pauVar17) [32];
  undefined1 auVar18 [16];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar19 [32];
  
  iVar12 = bottom_top_blob->elempack;
  iVar10 = bottom_top_blob->dims;
  iVar9 = bottom_top_blob->w;
  uVar2 = bottom_top_blob->h;
  if (iVar10 == 3) {
    iVar10 = iVar9 * iVar12 * uVar2;
    uVar13 = 0;
    uVar2 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar2 = 0;
    }
    pp_Var3 = this->_vptr_PReLU_x86_fma;
    for (; uVar13 != uVar2; uVar13 = uVar13 + 1) {
      pfVar6 = *(float **)(&this->field_0xd8 + (long)pp_Var3[-3]);
      if (*(int *)(&this->field_0xd0 + (long)pp_Var3[-3]) < 2) {
        fVar20 = *pfVar6;
        auVar22._4_4_ = fVar20;
        auVar22._0_4_ = fVar20;
        auVar22._8_4_ = fVar20;
        auVar22._12_4_ = fVar20;
LAB_002e808c:
        auVar24._16_16_ = auVar22;
        auVar24._0_16_ = auVar22;
      }
      else {
        fVar20 = pfVar6[uVar13];
        if (iVar12 == 4) {
          auVar22 = *(undefined1 (*) [16])(pfVar6 + uVar13 * 4);
          goto LAB_002e808c;
        }
        auVar22 = vshufps_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20),0);
        if (iVar12 != 8) goto LAB_002e808c;
        auVar24 = *(undefined1 (*) [32])(pfVar6 + uVar13 * 8);
      }
      pvVar5 = bottom_top_blob->data;
      sVar7 = bottom_top_blob->elemsize;
      sVar8 = bottom_top_blob->cstep;
      pauVar17 = (undefined1 (*) [32])(sVar8 * uVar13 * sVar7 + (long)pvVar5);
      lVar11 = 0;
      for (iVar9 = 0; iVar9 + 7 < iVar10; iVar9 = iVar9 + 8) {
        auVar23 = vmaxps_avx(*pauVar17,ZEXT1232(ZEXT812(0)));
        auVar19 = vminps_avx(*pauVar17,ZEXT1232(ZEXT812(0)));
        auVar21 = vfmadd213ps_fma(auVar19,auVar24,auVar23);
        *pauVar17 = ZEXT1632(auVar21);
        pauVar17 = pauVar17 + 1;
        lVar11 = lVar11 + 8;
      }
      for (; iVar9 + 3 < iVar10; iVar9 = iVar9 + 4) {
        auVar21 = vmaxps_avx(*(undefined1 (*) [16])*pauVar17,ZEXT816(0));
        auVar18 = vminps_avx(*(undefined1 (*) [16])*pauVar17,ZEXT816(0));
        auVar21 = vfmadd213ps_fma(auVar18,auVar22,auVar21);
        *(undefined1 (*) [16])*pauVar17 = auVar21;
        pauVar17 = (undefined1 (*) [32])(*pauVar17 + 0x10);
        lVar11 = lVar11 + 4;
      }
      lVar16 = sVar8 * sVar7 * uVar13;
      for (; (int)lVar11 < iVar10; lVar11 = lVar11 + 1) {
        fVar1 = *(float *)((long)pvVar5 + lVar11 * 4 + lVar16);
        if (fVar1 < 0.0) {
          *(float *)((long)pvVar5 + lVar11 * 4 + lVar16) = fVar1 * fVar20;
        }
      }
    }
  }
  else if (iVar10 == 2) {
    iVar9 = iVar9 * iVar12;
    uVar14 = 0;
    uVar13 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar13 = uVar14;
    }
    pp_Var3 = this->_vptr_PReLU_x86_fma;
    for (; uVar14 != uVar13; uVar14 = uVar14 + 1) {
      pfVar6 = *(float **)(&this->field_0xd8 + (long)pp_Var3[-3]);
      if (*(int *)(&this->field_0xd0 + (long)pp_Var3[-3]) < 2) {
        fVar20 = *pfVar6;
        auVar21._4_4_ = fVar20;
        auVar21._0_4_ = fVar20;
        auVar21._8_4_ = fVar20;
        auVar21._12_4_ = fVar20;
LAB_002e7f51:
        auVar23._16_16_ = auVar21;
        auVar23._0_16_ = auVar21;
      }
      else {
        fVar20 = pfVar6[uVar14];
        if (iVar12 == 4) {
          auVar21 = *(undefined1 (*) [16])(pfVar6 + uVar14 * 4);
          goto LAB_002e7f51;
        }
        auVar21 = vshufps_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20),0);
        if (iVar12 != 8) goto LAB_002e7f51;
        auVar23 = *(undefined1 (*) [32])(pfVar6 + uVar14 * 8);
      }
      pvVar5 = bottom_top_blob->data;
      sVar7 = bottom_top_blob->elemsize;
      iVar10 = bottom_top_blob->w;
      pauVar17 = (undefined1 (*) [32])(uVar14 * (long)iVar10 * sVar7 + (long)pvVar5);
      lVar11 = 0;
      for (iVar15 = 0; iVar15 + 7 < iVar9; iVar15 = iVar15 + 8) {
        auVar24 = vmaxps_avx(*pauVar17,ZEXT832(0));
        auVar19 = vminps_avx(*pauVar17,ZEXT832(0));
        auVar22 = vfmadd213ps_fma(auVar19,auVar23,auVar24);
        *pauVar17 = ZEXT1632(auVar22);
        pauVar17 = pauVar17 + 1;
        lVar11 = lVar11 + 8;
      }
      for (; iVar15 + 3 < iVar9; iVar15 = iVar15 + 4) {
        auVar22 = vmaxps_avx(*(undefined1 (*) [16])*pauVar17,ZEXT816(0));
        auVar18 = vminps_avx(*(undefined1 (*) [16])*pauVar17,ZEXT816(0));
        auVar22 = vfmadd213ps_fma(auVar18,auVar21,auVar22);
        *(undefined1 (*) [16])*pauVar17 = auVar22;
        pauVar17 = (undefined1 (*) [32])(*pauVar17 + 0x10);
        lVar11 = lVar11 + 4;
      }
      lVar16 = sVar7 * uVar14 * (long)iVar10;
      for (; (int)lVar11 < iVar9; lVar11 = lVar11 + 1) {
        fVar1 = *(float *)((long)pvVar5 + lVar11 * 4 + lVar16);
        if (fVar1 < 0.0) {
          *(float *)((long)pvVar5 + lVar11 * 4 + lVar16) = fVar1 * fVar20;
        }
      }
    }
  }
  else if (iVar10 == 1) {
    iVar12 = iVar12 * iVar9;
    pp_Var3 = this->_vptr_PReLU_x86_fma;
    p_Var4 = pp_Var3[-3];
    pvVar5 = bottom_top_blob->data;
    pfVar6 = *(float **)(&this->field_0xd8 + (long)p_Var4);
    if (*(int *)(&this->field_0xd0 + (long)p_Var4) < 2) {
      fVar20 = *pfVar6;
      auVar18._4_4_ = fVar20;
      auVar18._0_4_ = fVar20;
      auVar18._8_4_ = fVar20;
      auVar18._12_4_ = fVar20;
      auVar19._16_4_ = fVar20;
      auVar19._0_16_ = auVar18;
      auVar19._20_4_ = fVar20;
      auVar19._24_4_ = fVar20;
      auVar19._28_4_ = fVar20;
      iVar10 = (int)((long)iVar12 / 8);
      lVar11 = 0;
      uVar13 = 0;
      if (0 < iVar10) {
        uVar13 = (long)iVar12 / 8 & 0xffffffff;
      }
      for (; uVar13 * 0x20 != lVar11; lVar11 = lVar11 + 0x20) {
        auVar24 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar5 + lVar11),ZEXT832(0));
        auVar23 = vminps_avx(*(undefined1 (*) [32])((long)pvVar5 + lVar11),ZEXT832(0));
        auVar22 = vfmadd213ps_fma(auVar23,auVar19,auVar24);
        *(undefined1 (*) [32])((long)pvVar5 + lVar11) = ZEXT1632(auVar22);
      }
      iVar9 = iVar10 * 8;
      uVar13 = (long)(iVar12 + iVar10 * -8) / 4;
      iVar10 = (int)uVar13;
      auVar22 = vshufps_avx(auVar18,auVar18,0);
      lVar11 = 0;
      uVar14 = 0;
      if (0 < iVar10) {
        uVar14 = uVar13 & 0xffffffff;
      }
      for (; uVar14 * 0x10 != lVar11; lVar11 = lVar11 + 0x10) {
        auVar21 = *(undefined1 (*) [16])((long)pvVar5 + lVar11 + (long)iVar9 * 4);
        auVar18 = vmaxps_avx(auVar21,ZEXT816(0) << 0x40);
        auVar21 = vminps_avx(auVar21,ZEXT816(0) << 0x40);
        auVar21 = vfmadd213ps_fma(auVar21,auVar22,auVar18);
        *(undefined1 (*) [16])((long)pvVar5 + lVar11 + (long)iVar9 * 4) = auVar21;
      }
      for (lVar11 = (long)(iVar9 + iVar10 * 4); lVar11 < iVar12; lVar11 = lVar11 + 1) {
        fVar1 = *(float *)((long)pvVar5 + lVar11 * 4);
        if (fVar1 < 0.0) {
          *(float *)((long)pvVar5 + lVar11 * 4) = fVar1 * fVar20;
        }
      }
    }
    else {
      iVar10 = (int)((long)iVar12 / 8);
      lVar11 = 0;
      uVar13 = 0;
      if (0 < iVar10) {
        uVar13 = (long)iVar12 / 8 & 0xffffffff;
      }
      for (; uVar13 * 0x20 != lVar11; lVar11 = lVar11 + 0x20) {
        auVar24 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar5 + lVar11),ZEXT1232(ZEXT812(0)));
        auVar23 = vminps_avx(*(undefined1 (*) [32])((long)pvVar5 + lVar11),ZEXT1232(ZEXT812(0)));
        auVar22 = vfmadd132ps_fma(auVar23,auVar24,*(undefined1 (*) [32])((long)pfVar6 + lVar11));
        *(undefined1 (*) [32])((long)pvVar5 + lVar11) = ZEXT1632(auVar22);
      }
      uVar13 = (long)(iVar12 + iVar10 * -8) / 4;
      iVar9 = (int)uVar13;
      lVar16 = (long)(iVar10 * 8);
      lVar11 = 0;
      uVar14 = 0;
      if (0 < iVar9) {
        uVar14 = uVar13 & 0xffffffff;
      }
      for (; uVar14 * 0x10 != lVar11; lVar11 = lVar11 + 0x10) {
        auVar22 = *(undefined1 (*) [16])((long)pvVar5 + lVar11 + lVar16 * 4);
        auVar21 = vmaxps_avx(auVar22,ZEXT416(0) << 0x20);
        auVar22 = vminps_avx(auVar22,ZEXT416(0) << 0x20);
        auVar22 = vfmadd132ps_fma(auVar22,auVar21,
                                  *(undefined1 (*) [16])((long)pfVar6 + lVar11 + lVar16 * 4));
        *(undefined1 (*) [16])((long)pvVar5 + lVar11 + lVar16 * 4) = auVar22;
      }
      for (lVar11 = (long)(iVar10 * 8 + iVar9 * 4); lVar11 < iVar12; lVar11 = lVar11 + 1) {
        fVar20 = *(float *)((long)pvVar5 + lVar11 * 4);
        if (fVar20 < 0.0) {
          *(float *)((long)pvVar5 + lVar11 * 4) =
               fVar20 * *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var3[-3]) + lVar11 * 4);
        }
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_load_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}